

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTransformUtil.h
# Opt level: O3

void btTransformUtil::calculateDiffAxisAngle
               (btTransform *transform0,btTransform *transform1,btVector3 *axis,btScalar *angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  float fVar16;
  btScalar bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  btQuaternion local_60;
  btMatrix3x3 local_50;
  
  fVar11 = (transform0->m_basis).m_el[1].m_floats[1];
  fVar19 = (transform0->m_basis).m_el[1].m_floats[2];
  fVar1 = (transform0->m_basis).m_el[1].m_floats[0];
  fVar21 = (transform0->m_basis).m_el[0].m_floats[0];
  fVar2 = (transform0->m_basis).m_el[0].m_floats[1];
  fVar12 = (transform0->m_basis).m_el[0].m_floats[2];
  fVar3 = (transform1->m_basis).m_el[0].m_floats[0];
  uVar15 = *(undefined8 *)(transform0->m_basis).m_el[2].m_floats;
  fVar4 = (transform0->m_basis).m_el[2].m_floats[2];
  fVar22 = (float)uVar15;
  fVar23 = (float)((ulong)uVar15 >> 0x20);
  fVar13 = fVar22 * fVar19 - fVar4 * fVar1;
  uVar15 = *(undefined8 *)((transform0->m_basis).m_el[2].m_floats + 1);
  fVar20 = (float)((ulong)uVar15 >> 0x20) * fVar11 - fVar19 * fVar23;
  fVar24 = fVar1 * fVar23 - fVar11 * fVar22;
  fVar25 = 1.0 / (fVar24 * fVar12 + fVar20 * fVar21 + fVar13 * fVar2);
  fVar5 = (transform1->m_basis).m_el[0].m_floats[1];
  fVar6 = (transform1->m_basis).m_el[0].m_floats[2];
  fVar7 = (transform1->m_basis).m_el[1].m_floats[0];
  fVar8 = (transform1->m_basis).m_el[1].m_floats[1];
  fVar9 = (transform1->m_basis).m_el[1].m_floats[2];
  fVar14 = (fVar2 * fVar19 + -fVar12 * fVar11) * fVar25;
  fVar16 = (fVar12 * fVar1 + -fVar21 * fVar19) * fVar25;
  fVar10 = (fVar21 * fVar11 + -fVar2 * fVar1) * fVar25;
  fVar18 = ((float)uVar15 * fVar12 - fVar2 * fVar4) * fVar25;
  fVar20 = fVar20 * fVar25;
  fVar12 = (fVar4 * fVar21 - fVar22 * fVar12) * fVar25;
  fVar13 = fVar13 * fVar25;
  fVar21 = fVar25 * (fVar2 * fVar22 - fVar21 * fVar23);
  fVar25 = fVar25 * fVar24;
  fVar11 = (transform1->m_basis).m_el[2].m_floats[0];
  local_50.m_el[0].m_floats[2] = fVar5 * fVar16 + fVar14 * fVar3 + fVar10 * fVar6;
  local_50.m_el[1].m_floats[2] = fVar10 * fVar9 + fVar14 * fVar7 + fVar16 * fVar8;
  fVar19 = (transform1->m_basis).m_el[2].m_floats[1];
  fVar1 = (transform1->m_basis).m_el[2].m_floats[2];
  local_50.m_el[2].m_floats[2] = fVar10 * fVar1 + fVar14 * fVar11 + fVar16 * fVar19;
  local_50.m_el[0].m_floats[1] = fVar6 * fVar21 + fVar3 * fVar18 + fVar5 * fVar12;
  local_50.m_el[0].m_floats[0] = fVar6 * fVar25 + fVar3 * fVar20 + fVar5 * fVar13;
  local_50.m_el[0].m_floats[3] = 0.0;
  local_50.m_el[1].m_floats[1] = fVar9 * fVar21 + fVar7 * fVar18 + fVar8 * fVar12;
  local_50.m_el[1].m_floats[0] = fVar9 * fVar25 + fVar7 * fVar20 + fVar8 * fVar13;
  local_50.m_el[1].m_floats[3] = 0.0;
  local_50.m_el[2].m_floats[1] = fVar1 * fVar21 + fVar11 * fVar18 + fVar19 * fVar12;
  local_50.m_el[2].m_floats[0] = fVar1 * fVar25 + fVar11 * fVar20 + fVar19 * fVar13;
  local_50.m_el[2].m_floats[3] = 0.0;
  btMatrix3x3::getRotation(&local_50,&local_60);
  fVar19 = 1.0 / SQRT(local_60.super_btQuadWord.m_floats[3] * local_60.super_btQuadWord.m_floats[3]
                      + local_60.super_btQuadWord.m_floats[2] *
                        local_60.super_btQuadWord.m_floats[2] +
                        local_60.super_btQuadWord.m_floats[0] *
                        local_60.super_btQuadWord.m_floats[0] +
                        local_60.super_btQuadWord.m_floats[1] *
                        local_60.super_btQuadWord.m_floats[1]);
  local_60.super_btQuadWord.m_floats[0] = fVar19 * local_60.super_btQuadWord.m_floats[0];
  local_60.super_btQuadWord.m_floats[1] = fVar19 * local_60.super_btQuadWord.m_floats[1];
  local_60.super_btQuadWord.m_floats[2] = local_60.super_btQuadWord.m_floats[2] * fVar19;
  fVar11 = -1.0;
  if (-1.0 <= fVar19 * local_60.super_btQuadWord.m_floats[3]) {
    fVar11 = fVar19 * local_60.super_btQuadWord.m_floats[3];
  }
  fVar19 = 1.0;
  if (fVar11 <= 1.0) {
    fVar19 = fVar11;
  }
  fVar11 = acosf(fVar19);
  *angle = fVar11 + fVar11;
  axis->m_floats[3] = 0.0;
  fVar11 = local_60.super_btQuadWord.m_floats[2] * local_60.super_btQuadWord.m_floats[2] +
           local_60.super_btQuadWord.m_floats[0] * local_60.super_btQuadWord.m_floats[0] +
           local_60.super_btQuadWord.m_floats[1] * local_60.super_btQuadWord.m_floats[1];
  if (1.4210855e-14 <= fVar11) {
    fVar11 = 1.0 / SQRT(fVar11);
    uVar15 = CONCAT44(fVar11 * local_60.super_btQuadWord.m_floats[1],
                      fVar11 * local_60.super_btQuadWord.m_floats[0]);
    bVar17 = fVar11 * local_60.super_btQuadWord.m_floats[2];
  }
  else {
    uVar15 = 0x3f800000;
    bVar17 = 0.0;
  }
  *(undefined8 *)axis->m_floats = uVar15;
  axis->m_floats[2] = bVar17;
  return;
}

Assistant:

static void calculateDiffAxisAngle(const btTransform& transform0,const btTransform& transform1,btVector3& axis,btScalar& angle)
	{
		btMatrix3x3 dmat = transform1.getBasis() * transform0.getBasis().inverse();
		btQuaternion dorn;
		dmat.getRotation(dorn);

		///floating point inaccuracy can lead to w component > 1..., which breaks 
		dorn.normalize();
		
		angle = dorn.getAngle();
		axis = btVector3(dorn.x(),dorn.y(),dorn.z());
		axis[3] = btScalar(0.);
		//check for axis length
		btScalar len = axis.length2();
		if (len < SIMD_EPSILON*SIMD_EPSILON)
			axis = btVector3(btScalar(1.),btScalar(0.),btScalar(0.));
		else
			axis /= btSqrt(len);
	}